

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_stream.c
# Opt level: O3

int nghttp3_stream_write_settings(nghttp3_stream *stream,nghttp3_frame_entry *frent)

{
  anon_union_8_2_e537d9da_for_aux aVar1;
  int iVar2;
  size_t need;
  nghttp3_buf *chunk;
  long lVar3;
  ulong uVar4;
  nghttp3_typed_buf tbuf;
  nghttp3_frame_settings local_158;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  nghttp3_typed_buf local_40;
  
  memset(&local_158.hd.length,0,0x110);
  local_158.hd.type = 4;
  local_158.niv = 3;
  aVar1 = frent->aux;
  local_158.iv[0].id = 6;
  local_158.iv[0].value = *(uint64_t *)aVar1;
  local_130 = 1;
  local_128 = *(undefined8 *)((long)aVar1 + 8);
  local_120 = 7;
  local_118 = *(undefined8 *)((long)aVar1 + 0x18);
  if (*(char *)((long)aVar1 + 0x21) == '\0') {
    lVar3 = 3;
  }
  else {
    local_110 = 0x33;
    local_108 = 1;
    local_158.niv = 4;
    lVar3 = 4;
  }
  if (*(char *)((long)aVar1 + 0x20) != '\0') {
    uVar4 = (ulong)(uint)((int)lVar3 << 4);
    *(undefined8 *)((long)&local_158.iv[0].id + uVar4) = 8;
    *(undefined8 *)((long)&local_158.iv[0].value + uVar4) = 1;
    local_158.niv = lVar3 + 1;
  }
  need = nghttp3_frame_write_settings_len(&local_158.hd.length,&local_158);
  iVar2 = nghttp3_stream_ensure_chunk(stream,need);
  if (iVar2 == 0) {
    chunk = nghttp3_stream_get_chunk(stream);
    nghttp3_typed_buf_shared_init(&local_40,chunk);
    local_40.buf.last = nghttp3_frame_write_settings(chunk->last,&local_158);
    chunk->last = local_40.buf.last;
    iVar2 = nghttp3_stream_outq_add(stream,&local_40);
  }
  return iVar2;
}

Assistant:

int nghttp3_stream_write_settings(nghttp3_stream *stream,
                                  nghttp3_frame_entry *frent) {
  size_t len;
  int rv;
  nghttp3_buf *chunk;
  nghttp3_typed_buf tbuf;
  struct {
    nghttp3_frame_settings settings;
    nghttp3_settings_entry iv[15];
  } fr = {
    .settings =
      {
        .hd =
          {
            .type = NGHTTP3_FRAME_SETTINGS,
          },
        .niv = 3,
      },
  };
  nghttp3_settings_entry *iv;
  nghttp3_settings *local_settings = frent->aux.settings.local_settings;

  iv = &fr.settings.iv[0];

  iv[0].id = NGHTTP3_SETTINGS_ID_MAX_FIELD_SECTION_SIZE;
  iv[0].value = local_settings->max_field_section_size;
  iv[1].id = NGHTTP3_SETTINGS_ID_QPACK_MAX_TABLE_CAPACITY;
  iv[1].value = local_settings->qpack_max_dtable_capacity;
  iv[2].id = NGHTTP3_SETTINGS_ID_QPACK_BLOCKED_STREAMS;
  iv[2].value = local_settings->qpack_blocked_streams;

  if (local_settings->h3_datagram) {
    iv[fr.settings.niv].id = NGHTTP3_SETTINGS_ID_H3_DATAGRAM;
    iv[fr.settings.niv].value = 1;

    ++fr.settings.niv;
  }

  if (local_settings->enable_connect_protocol) {
    iv[fr.settings.niv].id = NGHTTP3_SETTINGS_ID_ENABLE_CONNECT_PROTOCOL;
    iv[fr.settings.niv].value = 1;

    ++fr.settings.niv;
  }

  len = nghttp3_frame_write_settings_len(&fr.settings.hd.length, &fr.settings);

  rv = nghttp3_stream_ensure_chunk(stream, len);
  if (rv != 0) {
    return rv;
  }

  chunk = nghttp3_stream_get_chunk(stream);
  nghttp3_typed_buf_shared_init(&tbuf, chunk);

  chunk->last = nghttp3_frame_write_settings(chunk->last, &fr.settings);

  tbuf.buf.last = chunk->last;

  return nghttp3_stream_outq_add(stream, &tbuf);
}